

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkDarExtWin(Abc_Ntk_t *pNtk,int nObjId,int nDist,int fVerbose)

{
  int iVar1;
  Aig_Man_t *p;
  Aig_Man_t *pMan_00;
  char *pcVar2;
  Aig_Obj_t *local_48;
  Aig_Obj_t *pObj;
  Aig_Man_t *pMan;
  Aig_Man_t *pMan1;
  Abc_Ntk_t *pNtkAig;
  int fVerbose_local;
  int nDist_local;
  int nObjId_local;
  Abc_Ntk_t *pNtk_local;
  
  p = Abc_NtkToDar(pNtk,0,1);
  if (p == (Aig_Man_t *)0x0) {
    return (Abc_Ntk_t *)0x0;
  }
  if (nObjId == -1) {
    local_48 = Saig_ManFindPivot(p);
    Abc_Print(1,"Selected object %d as a window pivot.\n",(ulong)(uint)local_48->Id);
  }
  else {
    iVar1 = Aig_ManObjNumMax(p);
    if (iVar1 <= nObjId) {
      Aig_ManStop(p);
      Abc_Print(1,"The ID is too large.\n");
      return (Abc_Ntk_t *)0x0;
    }
    local_48 = Aig_ManObj(p,nObjId);
    if (local_48 == (Aig_Obj_t *)0x0) {
      Aig_ManStop(p);
      Abc_Print(1,"Object with ID %d does not exist.\n",(ulong)(uint)nObjId);
      return (Abc_Ntk_t *)0x0;
    }
    iVar1 = Saig_ObjIsLo(p,local_48);
    if ((iVar1 == 0) && (iVar1 = Aig_ObjIsNode(local_48), iVar1 == 0)) {
      Aig_ManStop(p);
      Abc_Print(1,"Object with ID %d is not a node or reg output.\n",(ulong)(uint)nObjId);
      return (Abc_Ntk_t *)0x0;
    }
  }
  pMan_00 = Saig_ManWindowExtract(p,local_48,nDist);
  Aig_ManStop(p);
  if (pMan_00 == (Aig_Man_t *)0x0) {
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    pNtk_local = Abc_NtkFromAigPhase(pMan_00);
    pcVar2 = Extra_UtilStrsav(pNtk->pName);
    pNtk_local->pName = pcVar2;
    pcVar2 = Extra_UtilStrsav(pNtk->pSpec);
    pNtk_local->pSpec = pcVar2;
    Aig_ManStop(pMan_00);
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkDarExtWin( Abc_Ntk_t * pNtk, int nObjId, int nDist, int fVerbose )
{
    Abc_Ntk_t * pNtkAig;
    Aig_Man_t * pMan1, * pMan;
    Aig_Obj_t * pObj;
    pMan1 = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan1 == NULL )
        return NULL;
    if ( nObjId == -1 )
    {
        pObj = Saig_ManFindPivot( pMan1 );
        Abc_Print( 1, "Selected object %d as a window pivot.\n", pObj->Id );
    }
    else
    {
        if ( nObjId >= Aig_ManObjNumMax(pMan1) )
        {
            Aig_ManStop( pMan1 );
            Abc_Print( 1, "The ID is too large.\n" );
            return NULL;
        }
        pObj = Aig_ManObj( pMan1, nObjId );
        if ( pObj == NULL )
        {
            Aig_ManStop( pMan1 );
            Abc_Print( 1, "Object with ID %d does not exist.\n", nObjId );
            return NULL;
        }
        if ( !Saig_ObjIsLo(pMan1, pObj) && !Aig_ObjIsNode(pObj) )
        {
            Aig_ManStop( pMan1 );
            Abc_Print( 1, "Object with ID %d is not a node or reg output.\n", nObjId );
            return NULL;
        }
    }
    pMan = Saig_ManWindowExtract( pMan1, pObj, nDist );
    Aig_ManStop( pMan1 );
    if ( pMan == NULL )
        return NULL;
    pNtkAig = Abc_NtkFromAigPhase( pMan );
    pNtkAig->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkAig->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    Aig_ManStop( pMan );
    return pNtkAig;
}